

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_glyphslot_alloc_bitmap(FT_GlyphSlot slot,FT_ULong size)

{
  FT_Pointer pvVar1;
  FT_Error local_24;
  FT_Memory pFStack_20;
  FT_Error error;
  FT_Memory memory;
  FT_ULong size_local;
  FT_GlyphSlot slot_local;
  
  pFStack_20 = slot->face->memory;
  memory = (FT_Memory)size;
  size_local = (FT_ULong)slot;
  if ((slot->internal->flags & 1) == 0) {
    slot->internal->flags = slot->internal->flags | 1;
  }
  else {
    ft_mem_free(pFStack_20,(slot->bitmap).buffer);
    *(undefined8 *)(size_local + 0xa8) = 0;
  }
  pvVar1 = ft_mem_alloc(pFStack_20,(FT_Long)memory,&local_24);
  *(FT_Pointer *)(size_local + 0xa8) = pvVar1;
  return local_24;
}

Assistant:

FT_BASE_DEF( FT_Error )
  ft_glyphslot_alloc_bitmap( FT_GlyphSlot  slot,
                             FT_ULong      size )
  {
    FT_Memory  memory = FT_FACE_MEMORY( slot->face );
    FT_Error   error;


    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
      FT_FREE( slot->bitmap.buffer );
    else
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    (void)FT_ALLOC( slot->bitmap.buffer, size );
    return error;
  }